

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCutUtils.c
# Opt level: O3

void Map_CutListRecycle(Map_Man_t *p,Map_Cut_t *pSetList,Map_Cut_t *pSave)

{
  Map_Cut_t *pMVar1;
  Map_Cut_t *pTemp;
  
  if (pSetList != (Map_Cut_t *)0x0) {
    do {
      pMVar1 = pSetList->pNext;
      if (pSetList != pSave) {
        Extra_MmFixedEntryRecycle(p->mmCuts,(char *)pSetList);
      }
      pSetList = pMVar1;
    } while (pMVar1 != (Map_Cut_t *)0x0);
  }
  return;
}

Assistant:

void Map_CutListRecycle( Map_Man_t * p, Map_Cut_t * pSetList, Map_Cut_t * pSave )
{
    Map_Cut_t * pNext, * pTemp;
    for ( pTemp = pSetList, pNext = pTemp? pTemp->pNext : NULL; 
          pTemp; 
          pTemp = pNext, pNext = pNext? pNext->pNext : NULL )
        if ( pTemp != pSave )
            Extra_MmFixedEntryRecycle( p->mmCuts, (char *)pTemp );
}